

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pre-process.c
# Opt level: O3

int handle_nostdinc(dmr_C *C,stream *stream,token **line,token *token)

{
  *C->sys_includepath = (char *)0x0;
  return 1;
}

Assistant:

static int handle_nostdinc(struct dmr_C *C, struct stream *stream, struct token **line, struct token *token)
{
        (void) token;
        (void) line;
        (void) stream;
	/*
	 * Do we have any non-system includes?
	 * Clear them out if so..
	 */
	*C->sys_includepath = NULL;
	return 1;
}